

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzhamtest.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  lzham_uint32 lVar1;
  int iVar2;
  int in_EDI;
  int exit_status;
  int i;
  string_array cmd_line;
  int num_helper_threads;
  lzham_impl lzham_lib;
  ilzham *in_stack_00000168;
  int in_stack_00000174;
  string_array *in_stack_00000178;
  value_type *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff10;
  allocator<char> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff50;
  int local_94;
  lzham_impl local_68;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_8 = in_EDI;
  printf("LZHAM Codec - x64 Command Line Test App - Compiled %s %s\n","May  2 2025","16:12:12");
  printf("Expecting LZHAM DLL Version 0x%04X\n",0x1006);
  lzham_impl::lzham_impl
            ((lzham_impl *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  lzham_impl::load(&local_68);
  printf("Using static libraries.\n");
  lVar1 = (*local_68.super_ilzham.lzham_get_version)();
  printf("Loaded LZHAM DLL version 0x%04X\n\n",(ulong)lVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x113c68);
  for (local_94 = 1; local_94 < local_8; local_94 = local_94 + 1) {
    in_stack_ffffffffffffff10 =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&stack0xffffffffffffff47;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                in_stack_fffffffffffffef8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff47);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  iVar2 = main_internal(in_stack_00000178,in_stack_00000174,in_stack_00000168);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_ffffffffffffff10);
  lzham_impl::unload((lzham_impl *)0x113d99);
  local_4 = iVar2;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_ffffffffffffff10);
  lzham_impl::~lzham_impl((lzham_impl *)0x113dbd);
  return local_4;
}

Assistant:

int main(int argc, char *argv[])
#endif
{
#ifdef _XBOX
   int argc = 3;
   char *argv[4] = { "", "A", "E:\\samples", "" };

   DmMapDevkitDrive();
#endif

#if defined(_M_X64) || defined(__x86_64__)
   printf("LZHAM Codec - x64 Command Line Test App - Compiled %s %s\n", __DATE__, __TIME__);
#else
   printf("LZHAM Codec - x86 Command Line Test App - Compiled %s %s\n", __DATE__, __TIME__);
#endif

   printf("Expecting LZHAM DLL Version 0x%04X\n", LZHAM_DLL_VERSION);

#if LZHAM_STATIC_LIB
   lzham_impl lzham_lib;
   lzham_lib.load();
   printf("Using static libraries.\n");
#else
   lzham_dll_loader lzham_lib;
   char lzham_dll_filename[MAX_PATH];
   lzham_dll_loader::create_module_path(lzham_dll_filename, MAX_PATH, g_is_debug);
   printf("Dynamically loading DLL \"%s\"\n", lzham_dll_filename);

   HRESULT hres = lzham_lib.load(lzham_dll_filename);
   if (FAILED(hres))
   {
      print_error("Failed loading LZHAM DLL (Status=0x%04X)!\n", (uint)hres);
      return EXIT_FAILURE;
   }
#endif

   int num_helper_threads = 0;

#ifdef _XBOX
   num_helper_threads = 5;
#elif defined(WIN32)
   SYSTEM_INFO g_system_info;
   GetSystemInfo(&g_system_info);
   if (g_system_info.dwNumberOfProcessors > 1)
   {
      num_helper_threads = g_system_info.dwNumberOfProcessors - 1;
   }
#else
   num_helper_threads = 7;
#endif

   printf("Loaded LZHAM DLL version 0x%04X\n\n", lzham_lib.lzham_get_version());

   string_array cmd_line;
   for (int i = 1; i < argc; i++)
   {
      cmd_line.push_back(std::string(argv[i]));
   }

   int exit_status = main_internal(cmd_line, num_helper_threads, lzham_lib);

   lzham_lib.unload();

   return exit_status;
}